

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

int nghttp2_map_init(nghttp2_map *map,nghttp2_mem *mem)

{
  nghttp2_map_bucket *pnVar1;
  nghttp2_mem *mem_local;
  nghttp2_map *map_local;
  
  map->mem = mem;
  map->tablelen = 0x100;
  map->tablelenbits = 8;
  pnVar1 = (nghttp2_map_bucket *)nghttp2_mem_calloc(mem,(ulong)map->tablelen,0x10);
  map->table = pnVar1;
  if (map->table == (nghttp2_map_bucket *)0x0) {
    map_local._4_4_ = -0x385;
  }
  else {
    map->size = 0;
    map_local._4_4_ = 0;
  }
  return map_local._4_4_;
}

Assistant:

int nghttp2_map_init(nghttp2_map *map, nghttp2_mem *mem) {
  map->mem = mem;
  map->tablelen = 1 << NGHTTP2_INITIAL_TABLE_LENBITS;
  map->tablelenbits = NGHTTP2_INITIAL_TABLE_LENBITS;
  map->table =
      nghttp2_mem_calloc(mem, map->tablelen, sizeof(nghttp2_map_bucket));
  if (map->table == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  map->size = 0;

  return 0;
}